

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newConcurrencyLimitingHttpClient
          (kj *this,HttpClient *inner,uint maxConcurrentRequests,
          Function<void_(unsigned_int,_unsigned_int)> *countChangedCallback)

{
  Disposer *pDVar1;
  Iface *pIVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  Own<kj::HttpClient,_std::nullptr_t> OVar6;
  
  puVar3 = (undefined8 *)operator_new(0x78);
  pDVar1 = (countChangedCallback->impl).disposer;
  pIVar2 = (countChangedCallback->impl).ptr;
  (countChangedCallback->impl).ptr = (Iface *)0x0;
  *puVar3 = &PTR_request_006d9060;
  puVar3[1] = inner;
  *(uint *)(puVar3 + 2) = maxConcurrentRequests;
  *(undefined4 *)((long)puVar3 + 0x14) = 0;
  puVar3[3] = pDVar1;
  puVar3[4] = pIVar2;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[0xe] = 0;
  puVar3[6] = 8;
  pvVar4 = operator_new(0x40);
  puVar3[5] = pvVar4;
  pvVar5 = operator_new(0x200);
  *(void **)((long)pvVar4 + 0x18) = pvVar5;
  puVar3[10] = (long)pvVar4 + 0x18;
  puVar3[8] = pvVar5;
  OVar6.ptr = (HttpClient *)((long)pvVar5 + 0x200);
  puVar3[9] = OVar6.ptr;
  puVar3[0xe] = (long)pvVar4 + 0x18;
  puVar3[0xc] = pvVar5;
  puVar3[0xd] = OVar6.ptr;
  puVar3[7] = pvVar5;
  puVar3[0xb] = pvVar5;
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient>::instance;
  *(undefined8 **)(this + 8) = puVar3;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<HttpClient> newConcurrencyLimitingHttpClient(
    HttpClient& inner, uint maxConcurrentRequests,
    kj::Function<void(uint runningCount, uint pendingCount)> countChangedCallback) {
  return kj::heap<ConcurrencyLimitingHttpClient>(inner, maxConcurrentRequests,
      kj::mv(countChangedCallback));
}